

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc_utils.c
# Opt level: O0

void * lrtr_calloc(size_t nmemb,size_t size)

{
  long lVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int *piVar4;
  long in_FS_OFFSET;
  void *p;
  int bytes;
  size_t size_local;
  size_t nmemb_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((size == 0) ||
     (auVar2._8_8_ = 0, auVar2._0_8_ = size,
     nmemb <= SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar2,0))) {
    iVar3 = (int)size * (int)nmemb;
    nmemb_local = (size_t)lrtr_malloc((long)iVar3);
    if ((void *)nmemb_local != (void *)0x0) {
      memset((void *)nmemb_local,0,(long)iVar3);
    }
  }
  else {
    piVar4 = __errno_location();
    *piVar4 = 0xc;
    nmemb_local = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (void *)nmemb_local;
}

Assistant:

void *lrtr_calloc(size_t nmemb, size_t size)
{
	int bytes = 0;

#if __GNUC__ >= 5
	if (__builtin_mul_overflow(nmemb, size, &bytes)) {
		errno = ENOMEM;
		return 0;
	}
#else
	if (size && nmemb > (size_t)-1 / size) {
		errno = ENOMEM;
		return 0;
	}
	bytes = size * nmemb;
#endif
	void *p = lrtr_malloc(bytes);

	if (!p)
		return p;

	return memset(p, 0, bytes);
}